

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall
CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~CLParam
          (CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ~CLParam(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~CLParam() {}